

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateDynamicObjectAlloc
          (Lowerer *this,Instr *newObjInstr,uint inlineSlotCount,uint slotCount,RegOpnd *newObjDst,
          Opnd *typeSrc)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  DWORD DVar2;
  Opnd *pOVar3;
  RegOpnd *newObjDst_00;
  IndirOpnd *dst;
  uint uVar4;
  undefined1 isZeroed;
  uint uVar5;
  SymOpnd *local_50;
  SymOpnd *tempObjectSymOpnd;
  SymOpnd *local_40;
  uint local_38;
  bool local_31;
  
  tempObjectSymOpnd = (SymOpnd *)typeSrc;
  local_38 = inlineSlotCount;
  local_31 = GenerateRecyclerOrMarkTempAlloc
                       (this,newObjInstr,newObjDst,HelperAllocMemForScObject,
                        (ulong)inlineSlotCount * 8 + 0x20,&local_50);
  local_40 = local_50;
  if (local_50 != (SymOpnd *)0x0) {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,HoistMarkTempInitPhase,sourceContextId,functionId);
    if ((!bVar1) && (this->outerMostLoopLabel != (LabelInstr *)0x0)) {
      pOVar3 = LoadVTableValueOpnd(this,&this->outerMostLoopLabel->super_Instr,VtableDynamicObject);
      InsertMove(&local_40->super_Opnd,pOVar3,&this->outerMostLoopLabel->super_Instr,false);
      goto LAB_00563a6e;
    }
  }
  pOVar3 = LoadVTableValueOpnd(this,newObjInstr,VtableDynamicObject);
  GenerateMemInit(this,newObjDst,0,pOVar3,newObjInstr,false);
LAB_00563a6e:
  DVar2 = Js::DynamicObject::GetOffsetOfType();
  GenerateMemInit(this,newObjDst,DVar2,&tempObjectSymOpnd->super_Opnd,newObjInstr,false);
  isZeroed = local_31;
  uVar5 = (uint)local_31;
  uVar4 = slotCount - local_38;
  if (slotCount < local_38 || uVar4 == 0) {
    DVar2 = Js::DynamicObject::GetOffsetOfAuxSlots();
    GenerateMemInitNull(this,newObjDst,DVar2,newObjInstr,(bool)isZeroed);
  }
  else {
    newObjDst_00 = IR::RegOpnd::New(TyUint64,this->m_func);
    local_38 = uVar5;
    GenerateRecyclerAllocAligned
              (this,HelperAllocMemForVarArray,(ulong)uVar4 << 3,newObjDst_00,newObjInstr,false);
    DVar2 = Js::DynamicObject::GetOffsetOfAuxSlots();
    GenerateMemInit(this,newObjDst,DVar2,&newObjDst_00->super_Opnd,newObjInstr,false);
    DVar2 = Js::DynamicObject::GetOffsetOfAuxSlots();
    dst = IR::IndirOpnd::New(newObjDst,DVar2,TyUint64,this->m_func,false);
    isZeroed = (undefined1)local_38;
    InsertMove(&dst->super_Opnd,&newObjDst_00->super_Opnd,newObjInstr,true);
  }
  DVar2 = Js::DynamicObject::GetOffsetOfObjectArray();
  GenerateMemInitNull(this,newObjDst,DVar2,newObjInstr,(bool)isZeroed);
  return;
}

Assistant:

void
Lowerer::GenerateDynamicObjectAlloc(IR::Instr * newObjInstr, uint inlineSlotCount, uint slotCount, IR::RegOpnd * newObjDst, IR::Opnd * typeSrc)
{
    size_t headerAllocSize = sizeof(Js::DynamicObject) + inlineSlotCount * sizeof(Js::Var);
    IR::SymOpnd * tempObjectSymOpnd;
    bool isZeroed = GenerateRecyclerOrMarkTempAlloc(newObjInstr, newObjDst, IR::HelperAllocMemForScObject, headerAllocSize, &tempObjectSymOpnd);

    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        // Hoist the vtable init to the outer most loop top as it never changes
        InsertMove(tempObjectSymOpnd,
            LoadVTableValueOpnd(this->outerMostLoopLabel, VTableValue::VtableDynamicObject), this->outerMostLoopLabel, false);
    }
    else
    {
        // MOV [newObjDst + offset(vtable)], DynamicObject::vtable
        GenerateMemInit(newObjDst, 0, LoadVTableValueOpnd(newObjInstr, VTableValue::VtableDynamicObject), newObjInstr, isZeroed);
    }
    // MOV [newObjDst + offset(type)], newObjectType
    GenerateMemInit(newObjDst, Js::DynamicObject::GetOffsetOfType(), typeSrc, newObjInstr, isZeroed);

    // CALL JavascriptOperators::AllocMemForVarArray((slotCount - inlineSlotCount) * sizeof(Js::Var))
    if (slotCount > inlineSlotCount)
    {
        size_t auxSlotsAllocSize = (slotCount - inlineSlotCount) * sizeof(Js::Var);
        IR::RegOpnd* auxSlots = IR::RegOpnd::New(TyMachPtr, m_func);

        GenerateRecyclerAllocAligned(IR::HelperAllocMemForVarArray, auxSlotsAllocSize, auxSlots, newObjInstr);
        GenerateMemInit(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), auxSlots, newObjInstr, isZeroed);

        IR::IndirOpnd* newObjAuxSlots = IR::IndirOpnd::New(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func);
        this->InsertMove(newObjAuxSlots, auxSlots, newObjInstr);
    }
    else
    {
        GenerateMemInitNull(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), newObjInstr, isZeroed);
    }

    GenerateMemInitNull(newObjDst, Js::DynamicObject::GetOffsetOfObjectArray(), newObjInstr, isZeroed);
}